

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

char __thiscall Tokenizer::handleEscapeSequence(Tokenizer *this)

{
  char cVar1;
  runtime_error *this_00;
  string *in_stack_00000170;
  Tokenizer *in_stack_00000178;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string local_30 [47];
  char local_1;
  
  cVar1 = Stream::peek((Stream *)0x194e0b);
  switch(cVar1) {
  case '\"':
    local_1 = '\"';
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    makeErrorMessage(in_stack_00000178,in_stack_00000170);
    std::runtime_error::runtime_error(this_00,local_30);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case '\'':
    local_1 = '\'';
    break;
  case '?':
    local_1 = '?';
    break;
  case '\\':
    local_1 = '\\';
    break;
  case 'a':
    local_1 = '\a';
    break;
  case 'b':
    local_1 = '\b';
    break;
  case 'f':
    local_1 = '\f';
    break;
  case 'n':
    local_1 = '\n';
    break;
  case 'r':
    local_1 = '\r';
    break;
  case 't':
    local_1 = '\t';
    break;
  case 'v':
    local_1 = '\v';
  }
  return local_1;
}

Assistant:

char Tokenizer::handleEscapeSequence() const
{
  switch(stream_.peek())
  {
    case '\"':
      return '\"';
    case '\'':
      return '\'';
    case '\\':
      return '\\';
    case '\?':
      return '\?';
    case 'a':
      return '\a';
    case 'b':
      return '\b';
    case 't':
      return '\t';
    case 'v':
      return '\v';
    case 'n':
      return '\n';
    case 'r':
      return '\r';
    case 'f':
      return '\f';
    default:
      throw std::runtime_error(makeErrorMessage("Unexpected escape sequence!"));
  }
}